

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O2

void th06_dump(thecl_t *ecl,FILE *out)

{
  thecl_instr_type tVar1;
  uint uVar2;
  thecl_sub_t *sub;
  thecl_instr_t *ptVar3;
  void *pvVar4;
  thecl_param_t *ptVar5;
  bool bVar6;
  uint uVar7;
  list_node_t *plVar8;
  seqmap_entry_t *psVar9;
  char *pcVar10;
  list_node_t *plVar11;
  list_node_t *plVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  long *plVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  size_t __size;
  uint local_3c;
  
  if (out == (FILE *)0x0 || ecl == (thecl_t *)0x0) {
    return;
  }
  plVar8 = (list_node_t *)&ecl->subs;
  while (plVar8 = plVar8->next, plVar8 != (list_node_t *)0x0) {
    sub = (thecl_sub_t *)plVar8->data;
    local_3c = 0;
    fprintf((FILE *)out,"\nsub %s()\n{\n",sub->name);
    plVar12 = (list_node_t *)&sub->instrs;
LAB_001154c2:
    plVar12 = plVar12->next;
    if (plVar12 != (list_node_t *)0x0) {
      ptVar3 = (thecl_instr_t *)plVar12->data;
      switch(ptVar3->type) {
      case THECL_INSTR_INSTR:
        if (g_ecl_hexdebug == true) {
          fprintf((FILE *)out,"    /* %5x (+%5x) */ ",(ulong)ptVar3->address,(ulong)ptVar3->offset);
        }
        else {
          fwrite("    ",4,1,(FILE *)out);
        }
        psVar9 = seqmap_get(g_eclmap->ins_names,ptVar3->id);
        if (psVar9 == (seqmap_entry_t *)0x0) {
          fprintf((FILE *)out,"ins_%u(",(ulong)ptVar3->id);
        }
        else {
          fprintf((FILE *)out,"%s(",psVar9->value);
        }
        plVar11 = (list_node_t *)&ptVar3->params;
        bVar6 = false;
        while (plVar11 = plVar11->next, plVar11 != (list_node_t *)0x0) {
          ptVar5 = (thecl_param_t *)plVar11->data;
          if (bVar6) {
            fwrite(", ",2,1,(FILE *)out);
          }
          pcVar13 = th06_stringify_param(sub,ptVar3,ptVar5,ecl->version);
          fputs(pcVar13,(FILE *)out);
          free(pcVar13);
          bVar6 = true;
        }
        pcVar13 = ");\n";
        __size = 3;
        break;
      case THECL_INSTR_TIME:
        fprintf((FILE *)out,"+%u: //%u\n",(ulong)(ptVar3->time - local_3c));
        local_3c = ptVar3->time;
        goto LAB_001154c2;
      case THECL_INSTR_RANK:
        uVar2 = ptVar3->rank;
        if (uVar2 == 0xff) {
          pcVar13 = "!*";
        }
        else {
          uVar7 = get_default_none_rank(ecl->version);
          if (uVar2 != uVar7) {
            uVar2 = ptVar3->rank;
            auVar24._0_4_ = -(uint)((uVar2 & 8) == 0);
            auVar24._4_4_ = -(uint)((uVar2 & 4) == 0);
            auVar24._8_4_ = -(uint)((uVar2 & 2) == 0);
            auVar24._12_4_ = -(uint)((uVar2 & 1) == 0);
            auVar22._0_4_ = -(uint)((uVar2 & 0x80) == 0);
            auVar22._4_4_ = -(uint)((uVar2 & 0x40) == 0);
            auVar22._8_4_ = -(uint)((uVar2 & 0x20) == 0);
            auVar22._12_4_ = -(uint)((uVar2 & 0x10) == 0);
            auVar24 = packssdw(auVar22,auVar24);
            auVar24 = packsswb(auVar24,auVar24);
            pcVar13 = "E";
            pcVar19 = "";
            if ((auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar13 = "";
            }
            pcVar10 = "N";
            if ((auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar10 = "";
            }
            pcVar14 = "H";
            if ((auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar14 = "";
            }
            pcVar15 = "L";
            if ((auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar15 = "";
            }
            pcVar16 = "";
            if ((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar16 = "4";
            }
            pcVar17 = "";
            if ((auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar17 = "5";
            }
            pcVar18 = "";
            if ((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar18 = "6";
            }
            if ((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pcVar19 = "7";
            }
            fprintf((FILE *)out,"!%s%s%s%s%s%s%s%s",pcVar13,pcVar10,pcVar14,pcVar15,pcVar16,pcVar17,
                    pcVar18,pcVar19);
            goto LAB_001154c2;
          }
          pcVar13 = "!-";
        }
        __size = 2;
        break;
      case THECL_INSTR_LABEL:
        goto switchD_001154ef_caseD_3;
      default:
        goto switchD_001154ef_default;
      }
      fwrite(pcVar13,__size,1,(FILE *)out);
      goto LAB_001154c2;
    }
    fwrite("}\n",2,1,(FILE *)out);
  }
  plVar8 = (list_node_t *)&ecl->timelines;
LAB_0011576b:
  plVar8 = plVar8->next;
  if (plVar8 == (list_node_t *)0x0) {
    return;
  }
  pvVar4 = plVar8->data;
  uVar2 = 0;
  fprintf((FILE *)out,"\ntimeline %s()\n{\n",pvVar4);
  plVar20 = (long *)((long)pvVar4 + 0x100);
LAB_001157a2:
  plVar20 = (long *)*plVar20;
  if (plVar20 == (long *)0x0) goto LAB_001159c6;
  ptVar3 = (thecl_instr_t *)plVar20[2];
  tVar1 = ptVar3->type;
  if (tVar1 == THECL_INSTR_INSTR) {
    psVar9 = seqmap_get(g_eclmap->timeline_ins_names,ptVar3->id);
    if (psVar9 == (seqmap_entry_t *)0x0) {
      fprintf((FILE *)out,"    ins_%u(",(ulong)ptVar3->id);
    }
    else {
      fprintf((FILE *)out,"    %s(",psVar9->value);
    }
    plVar12 = (list_node_t *)&ptVar3->params;
    bVar6 = false;
    while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
      ptVar5 = (thecl_param_t *)plVar12->data;
      if (bVar6) {
        fwrite(", ",2,1,(FILE *)out);
      }
      pcVar13 = th06_stringify_param((thecl_sub_t *)0x0,ptVar3,ptVar5,ecl->version);
      fputs(pcVar13,(FILE *)out);
      free(pcVar13);
      bVar6 = true;
    }
    pcVar13 = ");\n";
  }
  else {
    if (tVar1 != THECL_INSTR_RANK) {
      if (tVar1 != THECL_INSTR_TIME) {
switchD_001154ef_default:
        abort();
      }
      if (ptVar3->time == 0xffff) {
        fprintf((FILE *)out,"%u:\n",0xffff);
      }
      else {
        fprintf((FILE *)out,"+%u: //%u\n",(ulong)(ptVar3->time - uVar2));
      }
      uVar2 = ptVar3->time;
      goto LAB_001157a2;
    }
    uVar7 = ptVar3->rank;
    if (uVar7 != 0xf0) {
      if (uVar7 == 0xff) {
        pcVar13 = "!*\n";
        goto LAB_00115897;
      }
      auVar21._0_4_ = -(uint)((uVar7 & 8) == 0);
      auVar21._4_4_ = -(uint)((uVar7 & 4) == 0);
      auVar21._8_4_ = -(uint)((uVar7 & 2) == 0);
      auVar21._12_4_ = -(uint)((uVar7 & 1) == 0);
      auVar23._0_4_ = -(uint)((uVar7 & 0x80) == 0);
      auVar23._4_4_ = -(uint)((uVar7 & 0x40) == 0);
      auVar23._8_4_ = -(uint)((uVar7 & 0x20) == 0);
      auVar23._12_4_ = -(uint)((uVar7 & 0x10) == 0);
      auVar24 = packssdw(auVar23,auVar21);
      auVar24 = packsswb(auVar24,auVar24);
      pcVar13 = "E";
      pcVar19 = "";
      if ((auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar10 = "N";
      if ((auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar10 = "";
      }
      pcVar14 = "H";
      if ((auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar15 = "L";
      if ((auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar16 = "";
      if ((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "4";
      }
      pcVar17 = "";
      if ((auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar17 = "5";
      }
      pcVar18 = "";
      if ((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "6";
      }
      if ((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar19 = "7";
      }
      fprintf((FILE *)out,"!%s%s%s%s%s%s%s%s\n",pcVar13,pcVar10,pcVar14,pcVar15,pcVar16,pcVar17,
              pcVar18,pcVar19);
      goto LAB_001157a2;
    }
    pcVar13 = "!-\n";
  }
LAB_00115897:
  fwrite(pcVar13,3,1,(FILE *)out);
  goto LAB_001157a2;
switchD_001154ef_caseD_3:
  fprintf((FILE *)out,"%s_%u:\n",sub->name,(ulong)ptVar3->offset);
  goto LAB_001154c2;
LAB_001159c6:
  fwrite("}\n",2,1,(FILE *)out);
  goto LAB_0011576b;
}

Assistant:

static void
th06_dump(
    const thecl_t* ecl,
    FILE* out)
{
    if (!ecl || !out)
        return;

    thecl_sub_t* sub;
    list_for_each(&ecl->subs, sub) {
        fprintf(out, "\nsub %s()\n{\n", sub->name);

        thecl_instr_t* instr;
        unsigned int time_last = 0;
        list_for_each(&sub->instrs, instr) {
            switch (instr->type) {
            case THECL_INSTR_TIME:
                fprintf(out, "+%u: //%u\n", instr->time - time_last, instr->time);
                time_last = instr->time;
                break;
            case THECL_INSTR_RANK:
                if(instr->rank == 0xFF) fprintf(out, "!*");
                else if(instr->rank == get_default_none_rank(ecl->version)) fprintf(out, "!-");
                else {
                    fprintf(out, "!%s%s%s%s%s%s%s%s",
                        (instr->rank) & RANK_EASY    ? "E" : "",
                        (instr->rank) & RANK_NORMAL  ? "N" : "",
                        (instr->rank) & RANK_HARD    ? "H" : "",
                        (instr->rank) & RANK_LUNATIC ? "L" : "",
                        !((instr->rank) & RANK_ID_4) ? "4" : "",
                        !((instr->rank) & RANK_ID_5) ? "5" : "",
                        !((instr->rank) & RANK_ID_6) ? "6" : "",
                        !((instr->rank) & RANK_ID_7) ? "7" : "");
                }
                break;
            case THECL_INSTR_LABEL:
                fprintf(out, "%s_%u:\n", sub->name, instr->offset);
                break;
            case THECL_INSTR_INSTR: {
                if (g_ecl_hexdebug) {
                    fprintf(out, "    /* %5x (+%5x) */ ", instr->address, instr->offset);
                } else {
                    fprintf(out, "    ");
                }
                seqmap_entry_t *ent = seqmap_get(g_eclmap->ins_names, instr->id);
                if (ent) {
                    fprintf(out, "%s(", ent->value);
                } else {
                    fprintf(out, "ins_%u(", instr->id);
                }
                thecl_param_t* param;
                int first = 1;
                list_for_each(&instr->params, param) {
                    if (!first) {
                        fprintf(out, ", ");
                    } else {
                        first = 0;
                    }

                    char* ret = th06_stringify_param(sub, instr, param, ecl->version);
                    fprintf(out, "%s", ret);
                    free(ret);
                }
                fprintf(out, ");\n");
                break;
            }
            default:
                abort();
            }
        }

        fprintf(out, "}\n");
    }

    thecl_timeline_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        fprintf(out, "\ntimeline %s()\n{\n", timeline->name);
        thecl_instr_t* instr;
        unsigned int time_last = 0;
        list_for_each(&timeline->instrs, instr) {
            switch(instr->type) {
            case THECL_INSTR_TIME:
                if (instr->time != 0xffff) /* The last ins has to always be 0xffff, so let's not make it relative... */
                    fprintf(out, "+%u: //%u\n", instr->time - time_last, instr->time);
                else
                    fprintf(out, "%u:\n", instr->time);
                time_last = instr->time;
                break;
            case THECL_INSTR_RANK:
                if(instr->rank == 0xFF) fprintf(out, "!*\n");
                else if(instr->rank == 0xF0) fprintf(out, "!-\n");
                else {
                    fprintf(out, "!%s%s%s%s%s%s%s%s\n",
                        (instr->rank) & RANK_EASY    ? "E" : "",
                        (instr->rank) & RANK_NORMAL  ? "N" : "",
                        (instr->rank) & RANK_HARD    ? "H" : "",
                        (instr->rank) & RANK_LUNATIC ? "L" : "",
                        !((instr->rank) & RANK_ID_4) ? "4" : "",
                        !((instr->rank) & RANK_ID_5) ? "5" : "",
                        !((instr->rank) & RANK_ID_6) ? "6" : "",
                        !((instr->rank) & RANK_ID_7) ? "7" : "");
                }
                break;
            case THECL_INSTR_INSTR: {
                seqmap_entry_t *ent = seqmap_get(g_eclmap->timeline_ins_names, instr->id);
                if (ent)
                    fprintf(out, "    %s(", ent->value);
                else
                    fprintf(out, "    ins_%u(", instr->id);

                int first = 1;
                thecl_param_t* param;
                list_for_each(&instr->params, param) {
                    if (!first) {
                        fprintf(out, ", ");
                    } else {
                        first = 0;
                    }

                    char* ret = th06_stringify_param(NULL, instr, param, ecl->version);
                    fprintf(out, "%s", ret);
                    free(ret);
                }
                fprintf(out, ");\n");
                break;
            }
            default:
                abort();
            }
        }
        fprintf(out, "}\n");
    }
}